

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wskey.cpp
# Opt level: O2

sha1 * __thiscall pstore::http::sha1::input(sha1 *this,span<const_unsigned_char,__1L> *span)

{
  uint64_t *puVar1;
  ulong uVar2;
  uint uVar3;
  reference ptVar4;
  iterator __end2;
  iterator __begin2;
  span<const_unsigned_char,__1L> local_38;
  span_iterator<pstore::gsl::span<const_unsigned_char,__1L>,_false> local_28;
  
  if ((((span->storage_).data_ != (pointer)0x0) && (this->computed_ == false)) &&
     (this->corrupted_ == false)) {
    pstore::gsl::span<const_unsigned_char,_-1L>::begin((span<const_unsigned_char,__1L> *)&local_28);
    pstore::gsl::span<const_unsigned_char,_-1L>::end(&local_38);
    while( true ) {
      if ((local_28.span_ ==
           (span<const_unsigned_char,__1L> *)local_38.storage_.super_extent_type<_1L>.size_) &&
         ((pointer)local_28.index_ == local_38.storage_.data_)) {
        return this;
      }
      ptVar4 = pstore::gsl::details::
               span_iterator<pstore::gsl::span<const_unsigned_char,_-1L>,_false>::operator*
                         (&local_28);
      uVar3 = this->index_;
      (this->message_block_)._M_elems[uVar3] = *ptVar4;
      uVar3 = uVar3 + 1;
      this->index_ = uVar3;
      puVar1 = &this->length_;
      uVar2 = *puVar1;
      *puVar1 = *puVar1 + 8;
      if (0xfffffffffffffff7 < uVar2) break;
      if (uVar3 == 0x40) {
        process_message_block(this);
      }
      pstore::gsl::details::span_iterator<pstore::gsl::span<const_unsigned_char,_-1L>,_false>::
      operator++(&local_28);
    }
    this->corrupted_ = true;
  }
  return this;
}

Assistant:

sha1 & sha1::input (gsl::span<std::uint8_t const> const & span) noexcept {
            if (span.data () == nullptr || computed_ || corrupted_) {
                return *this;
            }

            for (std::uint8_t const b : span) {
                message_block_[index_] = b;
                ++index_;

                auto const old_length = length_;
                length_ += 8;
                if (length_ < old_length) { // Detect overflow.
                    corrupted_ = true;      // Message is too long.
                    break;
                }

                if (index_ == 64) {
                    this->process_message_block ();
                }
            }
            return *this;
        }